

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

ssize_t __thiscall
kj::anon_unknown_31::PromiseOutputStream::write
          (PromiseOutputStream *this,int __fd,void *__buf,size_t __n)

{
  AsyncOutputStream *pAVar1;
  undefined4 in_register_00000034;
  Own<kj::AsyncOutputStream> *pOVar2;
  Own<kj::AsyncOutputStream> *local_68;
  PromiseOutputStream *local_60;
  ArrayPtr<const_unsigned_char> *pAStack_58;
  Type local_50;
  ArrayPtr<const_unsigned_char> *local_38;
  Own<kj::AsyncOutputStream> *local_30;
  Own<kj::AsyncOutputStream> *s;
  PromiseOutputStream *this_local;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> pieces_local;
  
  pOVar2 = (Own<kj::AsyncOutputStream> *)CONCAT44(in_register_00000034,__fd);
  s = pOVar2;
  this_local = (PromiseOutputStream *)__buf;
  pieces_local.ptr = (ArrayPtr<const_unsigned_char> *)__n;
  pieces_local.size_ = (size_t)this;
  local_30 = _::readMaybe<kj::AsyncOutputStream>
                       ((Maybe<kj::Own<kj::AsyncOutputStream>_> *)&pOVar2[1].ptr);
  if (local_30 == (Own<kj::AsyncOutputStream> *)0x0) {
    ForkedPromise<void>::addBranch((ForkedPromise<void> *)&local_50);
    local_60 = this_local;
    pAStack_58 = pieces_local.ptr;
    local_68 = pOVar2;
    Promise<void>::
    then<kj::(anonymous_namespace)::PromiseOutputStream::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_1_,kj::_::PropagateException>
              ((Promise<void> *)this,&local_50,(PropagateException *)&local_68);
    Promise<void>::~Promise((Promise<void> *)&local_50);
  }
  else {
    pAVar1 = Own<kj::AsyncOutputStream>::get(local_30);
    local_50.pieces.size_ = (size_t)this_local;
    local_38 = pieces_local.ptr;
    (*pAVar1->_vptr_AsyncOutputStream[1])(this,pAVar1,this_local,pieces_local.ptr);
  }
  return (ssize_t)this;
}

Assistant:

KJ_IF_MAYBE(s, stream) {
      return s->get()->write(pieces);
    }